

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlsio_openssl.c
# Opt level: O0

void on_underlying_io_open_complete(void *context,IO_OPEN_RESULT open_result)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  size_t sVar3;
  uchar *source;
  size_t sVar4;
  char *__s;
  LOGGER_LOG *local_178;
  size_t local_140;
  char *local_130;
  size_t local_118;
  LOGGER_LOG l_10;
  LOGGER_LOG l_9;
  LOGGER_LOG l_8;
  size_t malloc_size_1;
  char *connect_request;
  LOGGER_LOG l_7;
  char proxy_basic [30];
  char request_format [43];
  char *auth_string_payload;
  int connect_request_length;
  LOGGER_LOG l_6;
  LOGGER_LOG l_5;
  size_t malloc_size;
  int plain_auth_string_length;
  char *plain_auth_string_bytes;
  STRING_HANDLE encoded_auth_string;
  LOGGER_LOG l_4;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  HTTP_PROXY_IO_INSTANCE *http_proxy_io_instance;
  LOGGER_LOG l;
  IO_OPEN_RESULT open_result_local;
  void *context_local;
  
  if (context == (void *)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/http_proxy_io.c"
                ,"on_underlying_io_open_complete",0xfc,1,
                "NULL context in on_underlying_io_open_complete");
    }
  }
  else {
    iVar1 = *context;
    if (iVar1 == 1) {
      if (open_result == IO_OPEN_OK) {
        *(undefined4 *)context = 2;
        if (*(long *)((long)context + 0x68) == 0) {
          plain_auth_string_bytes = (char *)0x0;
        }
        else {
          sVar3 = strlen(*(char **)((long)context + 0x68));
          malloc_size._4_4_ = (int)sVar3 + 1;
          if (*(long *)((long)context + 0x70) != 0) {
            sVar3 = strlen(*(char **)((long)context + 0x70));
            malloc_size._4_4_ = (int)sVar3 + malloc_size._4_4_;
          }
          if ((int)malloc_size._4_4_ < 0) {
            plain_auth_string_bytes = (char *)0x0;
            indicate_open_complete_error_and_close((HTTP_PROXY_IO_INSTANCE *)context);
          }
          else {
            if (malloc_size._4_4_ < 0xfffffffe) {
              local_118 = (long)(int)malloc_size._4_4_ + 1;
            }
            else {
              local_118 = 0xffffffffffffffff;
            }
            if ((local_118 == 0xffffffffffffffff) ||
               (source = (uchar *)malloc(local_118), source == (uchar *)0x0)) {
              plain_auth_string_bytes = (char *)0x0;
              indicate_open_complete_error_and_close((HTTP_PROXY_IO_INSTANCE *)context);
            }
            else {
              if (*(long *)((long)context + 0x70) == 0) {
                local_130 = "";
              }
              else {
                local_130 = *(char **)((long)context + 0x70);
              }
              iVar1 = sprintf((char *)source,"%s:%s",*(undefined8 *)((long)context + 0x68),local_130
                             );
              if (iVar1 < 0) {
                plain_auth_string_bytes = (char *)0x0;
                indicate_open_complete_error_and_close((HTTP_PROXY_IO_INSTANCE *)context);
              }
              else {
                plain_auth_string_bytes =
                     (char *)Azure_Base64_Encode_Bytes(source,(long)(int)malloc_size._4_4_);
                if ((STRING_HANDLE)plain_auth_string_bytes == (STRING_HANDLE)0x0) {
                  p_Var2 = xlogging_get_log_function();
                  if (p_Var2 != (LOGGER_LOG)0x0) {
                    (*p_Var2)(AZ_LOG_ERROR,
                              "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/http_proxy_io.c"
                              ,"on_underlying_io_open_complete",0x15a,1,
                              "Cannot Base64 encode auth string");
                  }
                  indicate_open_complete_error_and_close((HTTP_PROXY_IO_INSTANCE *)context);
                }
              }
              free(source);
            }
          }
        }
        if ((*(long *)((long)context + 0x48) == 0) ||
           ((*(long *)((long)context + 0x68) != 0 && (plain_auth_string_bytes == (char *)0x0)))) {
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 != (LOGGER_LOG)0x0) {
            (*p_Var2)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/http_proxy_io.c"
                      ,"on_underlying_io_open_complete",0x16b,1,"Cannot create authorization header"
                     );
          }
        }
        else {
          memcpy(proxy_basic + 0x18,"CONNECT %s:%d HTTP/1.1\r\nHost:%s:%d%s%s\r\n\r\n",0x2b);
          l_7 = (LOGGER_LOG)0x2d79786f72500a0d;
          builtin_strncpy(proxy_basic,"authorization: Basic ",0x16);
          if (*(long *)((long)context + 0x68) == 0) {
            stack0xffffffffffffff78 = "";
          }
          else {
            register0x00000000 = STRING_c_str((STRING_HANDLE)plain_auth_string_bytes);
          }
          sVar3 = strlen(*(char **)((long)context + 0x48));
          sVar4 = strlen(stack0xffffffffffffff78);
          iVar1 = (int)sVar3 * 2 + 0x2a + (int)sVar4;
          auth_string_payload._4_4_ = iVar1 + 10;
          if (*(long *)((long)context + 0x68) != 0) {
            auth_string_payload._4_4_ = iVar1 + 0x27;
          }
          if ((int)auth_string_payload._4_4_ < 0) {
            p_Var2 = xlogging_get_log_function();
            if (p_Var2 != (LOGGER_LOG)0x0) {
              (*p_Var2)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/http_proxy_io.c"
                        ,"on_underlying_io_open_complete",0x188,1,
                        "Cannot encode the CONNECT request");
            }
            indicate_open_complete_error_and_close((HTTP_PROXY_IO_INSTANCE *)context);
          }
          else {
            if (auth_string_payload._4_4_ < 0xfffffffe) {
              local_140 = (long)(int)auth_string_payload._4_4_ + 1;
            }
            else {
              local_140 = 0xffffffffffffffff;
            }
            if ((local_140 == 0xffffffffffffffff) ||
               (__s = (char *)malloc(local_140), __s == (char *)0x0)) {
              p_Var2 = xlogging_get_log_function();
              if (p_Var2 != (LOGGER_LOG)0x0) {
                (*p_Var2)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/http_proxy_io.c"
                          ,"on_underlying_io_open_complete",0x193,1,
                          "Cannot allocate memory for CONNECT request");
              }
              indicate_open_complete_error_and_close((HTTP_PROXY_IO_INSTANCE *)context);
            }
            else {
              if (*(long *)((long)context + 0x68) == 0) {
                local_178 = (LOGGER_LOG *)0x124563;
              }
              else {
                local_178 = &l_7;
              }
              iVar1 = sprintf(__s,proxy_basic + 0x18,*(undefined8 *)((long)context + 0x48),
                              (ulong)*(uint *)((long)context + 0x50),
                              *(undefined8 *)((long)context + 0x48),
                              (ulong)*(uint *)((long)context + 0x50),local_178,
                              stack0xffffffffffffff78);
              if (iVar1 < 0) {
                p_Var2 = xlogging_get_log_function();
                if (p_Var2 != (LOGGER_LOG)0x0) {
                  (*p_Var2)(AZ_LOG_ERROR,
                            "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/http_proxy_io.c"
                            ,"on_underlying_io_open_complete",0x1a4,1,
                            "Cannot encode the CONNECT request");
                }
                indicate_open_complete_error_and_close((HTTP_PROXY_IO_INSTANCE *)context);
              }
              else {
                iVar1 = xio_send(*(XIO_HANDLE *)((long)context + 0x78),__s,(long)iVar1,
                                 unchecked_on_send_complete,(void *)0x0);
                if (iVar1 != 0) {
                  p_Var2 = xlogging_get_log_function();
                  if (p_Var2 != (LOGGER_LOG)0x0) {
                    (*p_Var2)(AZ_LOG_ERROR,
                              "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/http_proxy_io.c"
                              ,"on_underlying_io_open_complete",0x1ad,1,
                              "Could not send CONNECT request");
                  }
                  indicate_open_complete_error_and_close((HTTP_PROXY_IO_INSTANCE *)context);
                }
              }
              free(__s);
            }
          }
        }
        if (plain_auth_string_bytes != (char *)0x0) {
          STRING_delete((STRING_HANDLE)plain_auth_string_bytes);
        }
      }
      else if ((open_result == IO_OPEN_ERROR) || (open_result != IO_OPEN_CANCELLED)) {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/http_proxy_io.c"
                    ,"on_underlying_io_open_complete",0x119,1,"Underlying IO open failed");
        }
        indicate_open_complete_error_and_close((HTTP_PROXY_IO_INSTANCE *)context);
      }
      else {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/http_proxy_io.c"
                    ,"on_underlying_io_open_complete",0x11f,1,"Underlying IO open failed");
        }
        *(undefined4 *)context = 0;
        xio_close(*(XIO_HANDLE *)((long)context + 0x78),(ON_IO_CLOSE_COMPLETE)0x0,(void *)0x0);
        (**(code **)((long)context + 0x28))(*(undefined8 *)((long)context + 0x30),3);
      }
    }
    else if (iVar1 == 2) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/http_proxy_io.c"
                  ,"on_underlying_io_open_complete",0x10f,1,
                  "Open complete called again by underlying IO.");
      }
      indicate_open_complete_error_and_close((HTTP_PROXY_IO_INSTANCE *)context);
    }
    else if (iVar1 - 3U < 2) {
      (**(code **)((long)context + 0x18))(*(undefined8 *)((long)context + 0x20));
    }
    else {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/http_proxy_io.c"
                  ,"on_underlying_io_open_complete",0x104,1,
                  "on_underlying_io_open_complete called in an unexpected state.");
      }
    }
  }
  return;
}

Assistant:

static void on_underlying_io_open_complete(void* context, IO_OPEN_RESULT open_result)
{
    TLS_IO_INSTANCE* tls_io_instance = (TLS_IO_INSTANCE*)context;

    if (tls_io_instance->tlsio_state == TLSIO_STATE_OPENING_UNDERLYING_IO)
    {
        if (open_result == IO_OPEN_OK)
        {
            tls_io_instance->tlsio_state = TLSIO_STATE_IN_HANDSHAKE;

            // Begin the handshake process here. It continues in on_underlying_io_bytes_received
            send_handshake_bytes(tls_io_instance);
        }
        else
        {
            LogError("Invalid open_result. Expected result is IO_OPEN_OK.");
            tls_io_instance->tlsio_state = TLSIO_STATE_NOT_OPEN;
            indicate_open_complete(tls_io_instance, IO_OPEN_ERROR);
        }
    }
    else
    {
        LogError("Invalid tlsio_state. Expected state is TLSIO_STATE_OPENING_UNDERLYING_IO.");
    }
}